

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall
RTree::get_polygons_JSON(RTree *this,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *ans,string *json)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppdVar4;
  reference pvVar5;
  vector<Point,_std::allocator<Point>_> local_a8;
  string local_90;
  vector<Point,_std::allocator<Point>_> local_60;
  string local_48;
  int local_28;
  int local_24;
  int j;
  int i;
  string *json_local;
  vector<d_leaf_*,_std::allocator<d_leaf_*>_> *ans_local;
  RTree *this_local;
  
  _j = json;
  json_local = (string *)ans;
  ans_local = (vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)this;
  std::__cxx11::string::operator+=((string *)json,"[");
  local_24 = 0;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::size
                      ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)json_local);
    if (sVar3 <= uVar2) break;
    std::__cxx11::string::operator+=((string *)_j,"[");
    local_28 = 0;
    while( true ) {
      iVar1 = local_28;
      ppdVar4 = std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::operator[]
                          ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)json_local,(long)local_24)
      ;
      if ((*ppdVar4)->polygon->corners <= iVar1) break;
      std::__cxx11::string::operator+=((string *)_j,"[");
      ppdVar4 = std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::operator[]
                          ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)json_local,(long)local_24)
      ;
      Polygon::get_vertices(&local_60,(*ppdVar4)->polygon);
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[](&local_60,(long)local_28);
      iVar1 = Point::get_X(pvVar5);
      std::__cxx11::to_string(&local_48,iVar1);
      std::__cxx11::string::operator+=((string *)_j,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::vector<Point,_std::allocator<Point>_>::~vector(&local_60);
      std::__cxx11::string::operator+=((string *)_j,",");
      ppdVar4 = std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::operator[]
                          ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)json_local,(long)local_24)
      ;
      Polygon::get_vertices(&local_a8,(*ppdVar4)->polygon);
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[](&local_a8,(long)local_28);
      iVar1 = Point::get_Y(pvVar5);
      std::__cxx11::to_string(&local_90,iVar1);
      std::__cxx11::string::operator+=((string *)_j,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::vector<Point,_std::allocator<Point>_>::~vector(&local_a8);
      std::__cxx11::string::operator+=((string *)_j,"]");
      iVar1 = local_28 + 1;
      ppdVar4 = std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::operator[]
                          ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)json_local,(long)local_24)
      ;
      if (iVar1 != (*ppdVar4)->polygon->corners) {
        std::__cxx11::string::operator+=((string *)_j,",");
      }
      local_28 = local_28 + 1;
    }
    std::__cxx11::string::operator+=((string *)_j,"]");
    iVar1 = local_24 + 1;
    sVar3 = std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::size
                      ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)json_local);
    if ((long)iVar1 != sVar3) {
      std::__cxx11::string::operator+=((string *)_j,",");
    }
    local_24 = local_24 + 1;
  }
  std::__cxx11::string::operator+=((string *)_j,"]");
  return;
}

Assistant:

void RTree::get_polygons_JSON(const std::vector<d_leaf*> & ans,std::string &json){
    json += "[";
    for(int i=0; i<ans.size(); i++){
        json +="[";    
        for(int j = 0; j < ans[i]->polygon->corners;j++){
           json +="[";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_X());
           json += ",";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_Y()); 
           json +="]";
           if((j+1) != ans[i]->polygon->corners)
                json +=",";
        }
        json +="]";
        if((i+1) != ans.size())
            json +=",";
    }
    json += "]";
}